

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<wchar_t> *f)

{
  size_t sVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  wchar_t __tmp;
  wchar_t *__src;
  size_t size;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  buffer<wchar_t> *c;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar14 = (ulong)(uint)specs->width;
  uVar9 = f->size_;
  puVar3 = *(undefined8 **)this;
  lVar10 = puVar3[2];
  uVar11 = uVar14 - uVar9;
  if (uVar14 < uVar9 || uVar11 == 0) {
    uVar11 = lVar10 + uVar9;
    if ((ulong)puVar3[3] < uVar11) {
      (**(code **)*puVar3)(puVar3,uVar11);
      uVar9 = f->size_;
    }
    puVar3[2] = uVar11;
    if (uVar9 != 0) {
      pvVar12 = (void *)(lVar10 * 4 + puVar3[1]);
      __src = f->s;
LAB_001c8bb5:
      memmove(pvVar12,__src,uVar9 << 2);
      return;
    }
  }
  else {
    uVar13 = lVar10 + uVar14;
    if ((ulong)puVar3[3] < uVar13) {
      (**(code **)*puVar3)(puVar3,uVar13);
    }
    puVar3[2] = uVar13;
    auVar6 = _DAT_00207170;
    auVar5 = _DAT_00204580;
    auVar4 = _DAT_001fe020;
    lVar8 = puVar3[1];
    pvVar12 = (void *)(lVar8 + lVar10 * 4);
    wVar2 = (specs->fill).data_[0];
    bVar7 = specs->field_0x9 & 0xf;
    if (bVar7 == 3) {
      uVar13 = uVar11 >> 1;
      if (1 < uVar11) {
        pvVar12 = (void *)((long)pvVar12 + uVar13 * 4);
        uVar11 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        lVar8 = lVar8 + lVar10 * 4;
        lVar10 = 0;
        auVar25 = auVar25 ^ _DAT_001fe020;
        do {
          auVar22._8_4_ = (int)lVar10;
          auVar22._0_8_ = lVar10;
          auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar26 = (auVar22 | auVar5) ^ auVar4;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar8 + lVar10 * 4) = wVar2;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar8 + 4 + lVar10 * 4) = wVar2;
          }
          auVar22 = (auVar22 | auVar6) ^ auVar4;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar8 + 8 + lVar10 * 4) = wVar2;
            *(wchar_t *)(lVar8 + 0xc + lVar10 * 4) = wVar2;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar11 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(pvVar12,f->s,sVar1);
      }
      auVar6 = _DAT_00207170;
      auVar5 = _DAT_00204580;
      auVar4 = _DAT_001fe020;
      uVar11 = (uVar14 * 4 + (uVar9 + uVar13) * -4) - 4;
      auVar26._8_4_ = (int)uVar11;
      auVar26._0_8_ = uVar11;
      auVar26._12_4_ = (int)(uVar11 >> 0x20);
      auVar17._0_8_ = uVar11 >> 2;
      auVar17._8_8_ = auVar26._8_8_ >> 2;
      uVar9 = 0;
      auVar17 = auVar17 ^ _DAT_001fe020;
      do {
        auVar23._8_4_ = (int)uVar9;
        auVar23._0_8_ = uVar9;
        auVar23._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar23 | auVar5) ^ auVar4;
        iVar20 = auVar17._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          *(wchar_t *)((long)pvVar12 + uVar9 * 4 + sVar1) = wVar2;
        }
        if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
            auVar25._12_4_ <= auVar17._12_4_) {
          *(wchar_t *)((long)pvVar12 + uVar9 * 4 + sVar1 + 4) = wVar2;
        }
        auVar25 = (auVar23 | auVar6) ^ auVar4;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
          *(wchar_t *)((long)pvVar12 + uVar9 * 4 + sVar1 + 8) = wVar2;
          *(wchar_t *)((long)pvVar12 + uVar9 * 4 + sVar1 + 0xc) = wVar2;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
    }
    else if (bVar7 == 2) {
      pvVar12 = (void *)((long)pvVar12 + uVar11 * 4);
      uVar11 = (uVar14 * 4 + uVar9 * -4) - 4;
      auVar15._8_4_ = (int)uVar11;
      auVar15._0_8_ = uVar11;
      auVar15._12_4_ = (int)(uVar11 >> 0x20);
      auVar16._0_8_ = uVar11 >> 2;
      auVar16._8_8_ = auVar15._8_8_ >> 2;
      lVar8 = lVar8 + lVar10 * 4;
      uVar9 = 0;
      auVar16 = auVar16 ^ _DAT_001fe020;
      do {
        auVar21._8_4_ = (int)uVar9;
        auVar21._0_8_ = uVar9;
        auVar21._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar21 | auVar5) ^ auVar4;
        iVar20 = auVar16._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar8 + uVar9 * 4) = wVar2;
        }
        if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
            auVar25._12_4_ <= auVar16._12_4_) {
          *(wchar_t *)(lVar8 + 4 + uVar9 * 4) = wVar2;
        }
        auVar25 = (auVar21 | auVar6) ^ auVar4;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
          *(wchar_t *)(lVar8 + 8 + uVar9 * 4) = wVar2;
          *(wchar_t *)(lVar8 + 0xc + uVar9 * 4) = wVar2;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
      uVar9 = f->size_;
      if (uVar9 != 0) {
        __src = f->s;
        goto LAB_001c8bb5;
      }
    }
    else {
      sVar1 = f->size_ * 4;
      if (f->size_ != 0) {
        memmove(pvVar12,f->s,sVar1);
      }
      auVar6 = _DAT_00207170;
      auVar5 = _DAT_00204580;
      auVar4 = _DAT_001fe020;
      uVar11 = (uVar14 * 4 + uVar9 * -4) - 4;
      auVar18._8_4_ = (int)uVar11;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = (int)(uVar11 >> 0x20);
      auVar19._0_8_ = uVar11 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      lVar8 = lVar10 * 4 + sVar1 + lVar8;
      uVar9 = 0;
      auVar19 = auVar19 ^ _DAT_001fe020;
      do {
        auVar24._8_4_ = (int)uVar9;
        auVar24._0_8_ = uVar9;
        auVar24._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar24 | auVar5) ^ auVar4;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar8 + uVar9 * 4) = wVar2;
        }
        if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
            auVar25._12_4_ <= auVar19._12_4_) {
          *(wchar_t *)(lVar8 + 4 + uVar9 * 4) = wVar2;
        }
        auVar25 = (auVar24 | auVar6) ^ auVar4;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
          *(wchar_t *)(lVar8 + 8 + uVar9 * 4) = wVar2;
          *(wchar_t *)(lVar8 + 0xc + uVar9 * 4) = wVar2;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }